

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ping.cpp
# Opt level: O0

void configure_parser(Parser *parser)

{
  Parser *pPVar1;
  allocator local_221;
  string local_220 [39];
  allocator local_1f9;
  string local_1f8 [39];
  allocator local_1d1;
  string local_1d0 [39];
  allocator local_1a9;
  string local_1a8 [39];
  allocator local_181;
  string local_180 [39];
  allocator local_159;
  string local_158 [39];
  allocator local_131;
  string local_130 [39];
  allocator local_109;
  string local_108 [39];
  allocator local_e1;
  string local_e0 [39];
  allocator local_b9;
  string local_b8 [39];
  allocator local_91;
  string local_90 [39];
  allocator local_69;
  string local_68 [55];
  allocator local_31;
  string local_30 [32];
  Parser *local_10;
  Parser *parser_local;
  
  local_10 = parser;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"o",&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,"output",&local_69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,"/tmp/__test/chr",&local_91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b8,"Output chronicle path",&local_b9);
  cli::Parser::set_optional<std::__cxx11::string>
            (parser,(string *)local_30,(string *)local_68,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90,
             (string *)local_b8);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  pPVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e0,"n",&local_e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_108,"max-count",&local_109);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_130,"Number of entries written",&local_131);
  cli::Parser::set_optional<unsigned_long>
            (pPVar1,(string *)local_e0,(string *)local_108,10000000,(string *)local_130);
  std::__cxx11::string::~string(local_130);
  std::allocator<char>::~allocator((allocator<char> *)&local_131);
  std::__cxx11::string::~string(local_108);
  std::allocator<char>::~allocator((allocator<char> *)&local_109);
  std::__cxx11::string::~string(local_e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  pPVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_158,"w",&local_159);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_180,"writer-threads",&local_181);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1a8,"Number of writer threads",&local_1a9);
  cli::Parser::set_optional<unsigned_long>
            (pPVar1,(string *)local_158,(string *)local_180,4,(string *)local_1a8);
  std::__cxx11::string::~string(local_1a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
  std::__cxx11::string::~string(local_180);
  std::allocator<char>::~allocator((allocator<char> *)&local_181);
  std::__cxx11::string::~string(local_158);
  std::allocator<char>::~allocator((allocator<char> *)&local_159);
  pPVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1d0,"x",&local_1d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1f8,"delete",&local_1f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_220,"Delete the input chronicle at startup",&local_221);
  cli::Parser::set_optional<bool>
            (pPVar1,(string *)local_1d0,(string *)local_1f8,false,(string *)local_220);
  std::__cxx11::string::~string(local_220);
  std::allocator<char>::~allocator((allocator<char> *)&local_221);
  std::__cxx11::string::~string(local_1f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
  std::__cxx11::string::~string(local_1d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
  return;
}

Assistant:

void configure_parser(cli::Parser & parser)
{
    parser.set_optional<std::string>("o", "output", "/tmp/__test/chr", "Output chronicle path");
    parser.set_optional<std::size_t>("n", "max-count", 10000000, "Number of entries written");
    parser.set_optional<std::size_t>("w", "writer-threads", 4, "Number of writer threads");
    parser.set_optional<bool>("x", "delete", false, "Delete the input chronicle at startup");
}